

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math.cpp
# Opt level: O2

bool pbrt::CatmullRomWeights(span<const_float> nodes,Float x,int *offset,span<float> weights)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined1 auVar4 [16];
  bool bVar5;
  long lVar6;
  ulong uVar7;
  float *pfVar8;
  ulong uVar9;
  float *pfVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  undefined1 auVar15 [16];
  float fVar16;
  float fVar17;
  Float w3;
  Float w0;
  undefined1 auVar18 [16];
  int vb;
  size_t va;
  float fVar14;
  
  uVar9 = nodes.n;
  pfVar10 = nodes.ptr;
  va = weights.n;
  pfVar8 = weights.ptr;
  vb = 4;
  if (va < 4) {
    LogFatal<char_const(&)[15],char_const(&)[2],char_const(&)[15],unsigned_long&,char_const(&)[2],int&>
              (Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/math.cpp"
               ,0x9f,"Check failed: %s >= %s with %s = %s, %s = %s",(char (*) [15])0x27e887b,
               (char (*) [2])0x3e1e13,(char (*) [15])0x27e887b,&va,(char (*) [2])0x3e1e13,&vb);
  }
  if ((x < *pfVar10) || (pfVar10[uVar9 - 1] < x)) {
    bVar5 = false;
  }
  else {
    uVar7 = uVar9 - 2;
    lVar6 = 1;
    uVar12 = uVar7;
    while (uVar13 = uVar12, 0 < (long)uVar13) {
      uVar12 = uVar13 >> 1;
      if (pfVar10[(int)uVar12 + (int)lVar6] <= x) {
        lVar6 = uVar12 + 1 + lVar6;
        uVar12 = ~uVar12 + uVar13;
      }
    }
    if (lVar6 - 1U < uVar7) {
      uVar7 = lVar6 - 1U;
    }
    uVar12 = 0;
    if (0 < lVar6) {
      uVar12 = uVar7;
    }
    uVar11 = (int)uVar12 - 1;
    lVar6 = uVar12 << 0x20;
    *offset = uVar11;
    fVar16 = *(float *)((long)pfVar10 + (lVar6 >> 0x1e));
    fVar14 = *(float *)((long)pfVar10 + (lVar6 + 0x100000000 >> 0x1e));
    fVar3 = fVar14 - fVar16;
    auVar18._0_4_ = (x - fVar16) / fVar3;
    fVar1 = auVar18._0_4_ * auVar18._0_4_;
    fVar2 = auVar18._0_4_ * fVar1;
    auVar15 = vfmsub213ss_fma(SUB6416(ZEXT464(0x40000000),0),ZEXT416((uint)fVar2),
                              ZEXT416((uint)(fVar1 * 3.0)));
    fVar17 = auVar15._0_4_ + 1.0;
    auVar4 = vfmadd231ss_fma(ZEXT416((uint)(fVar1 * 3.0)),ZEXT416((uint)fVar2),
                             SUB6416(ZEXT464(0xc0000000),0));
    auVar15 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),ZEXT416((uint)fVar1),
                              ZEXT416((uint)fVar2));
    auVar18._0_4_ = auVar15._0_4_ + auVar18._0_4_;
    pfVar8[1] = fVar17;
    pfVar8[2] = auVar4._0_4_;
    if ((int)uVar12 < 1) {
      fVar17 = fVar17 - auVar18._0_4_;
      fVar14 = 0.0;
      pfVar8[1] = fVar17;
    }
    else {
      auVar18._0_4_ = (fVar3 * auVar18._0_4_) / (fVar14 - pfVar10[uVar11]);
      auVar18._4_12_ = SUB6012((undefined1  [60])0x0,0);
      auVar15._8_4_ = 0x80000000;
      auVar15._0_8_ = 0x8000000080000000;
      auVar15._12_4_ = 0x80000000;
      auVar15 = vxorps_avx512vl(auVar18,auVar15);
      fVar14 = auVar15._0_4_;
    }
    auVar18._0_4_ = auVar4._0_4_ + auVar18._0_4_;
    fVar2 = fVar2 - fVar1;
    *pfVar8 = fVar14;
    uVar7 = lVar6 + 0x200000000 >> 0x20;
    pfVar8[2] = auVar18._0_4_;
    if (uVar7 < uVar9) {
      fVar16 = (fVar3 * fVar2) / (pfVar10[uVar7] - fVar16);
      pfVar8[1] = fVar17 - fVar16;
    }
    else {
      pfVar8[1] = fVar17 - fVar2;
      pfVar8[2] = fVar2 + auVar18._0_4_;
      fVar16 = 0.0;
    }
    bVar5 = true;
    pfVar8[3] = fVar16;
  }
  return bVar5;
}

Assistant:

bool CatmullRomWeights(pstd::span<const Float> nodes, Float x, int *offset,
                       pstd::span<Float> weights) {
    CHECK_GE(weights.size(), 4);
    // Return _false_ if _x_ is out of bounds
    if (!(x >= nodes.front() && x <= nodes.back()))
        return false;

    // Search for the interval _idx_ containing _x_
    int idx = FindInterval(nodes.size(), [&](int i) { return nodes[i] <= x; });
    *offset = idx - 1;
    Float x0 = nodes[idx], x1 = nodes[idx + 1];

    // Compute the $t$ parameter and powers
    Float t = (x - x0) / (x1 - x0), t2 = t * t, t3 = t2 * t;

    // Compute initial node weights $w_1$ and $w_2$
    weights[1] = 2 * t3 - 3 * t2 + 1;
    weights[2] = -2 * t3 + 3 * t2;

    // Compute first node weight $w_0$
    if (idx > 0) {
        Float w0 = (t3 - 2 * t2 + t) * (x1 - x0) / (x1 - nodes[idx - 1]);
        weights[0] = -w0;
        weights[2] += w0;
    } else {
        Float w0 = t3 - 2 * t2 + t;
        weights[0] = 0;
        weights[1] -= w0;
        weights[2] += w0;
    }

    // Compute last node weight $w_3$
    if (idx + 2 < nodes.size()) {
        Float w3 = (t3 - t2) * (x1 - x0) / (nodes[idx + 2] - x0);
        weights[1] -= w3;
        weights[3] = w3;
    } else {
        Float w3 = t3 - t2;
        weights[1] -= w3;
        weights[2] += w3;
        weights[3] = 0;
    }

    return true;
}